

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GeluLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gelu(NeuralNetworkLayer *this)

{
  bool bVar1;
  GeluLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_gelu(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_gelu(this);
    this_00 = (GeluLayerParams *)operator_new(0x18);
    GeluLayerParams::GeluLayerParams(this_00);
    (this->layer_).gelu_ = this_00;
  }
  return (GeluLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GeluLayerParams* NeuralNetworkLayer::mutable_gelu() {
  if (!has_gelu()) {
    clear_layer();
    set_has_gelu();
    layer_.gelu_ = new ::CoreML::Specification::GeluLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gelu)
  return layer_.gelu_;
}